

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O3

void Omega_h::write_linear_scatterplot<2>
               (string *path,Mesh *mesh,Int ent_dim,Reals *data,Vector<2> direction,Vector<2> origin
               ,string *separator)

{
  int *piVar1;
  Vector<2> direction_00;
  Vector<2> origin_00;
  Alloc *pAVar2;
  Reals coords_1d;
  Reals coords;
  Reals local_b0;
  Reals local_a0;
  Reals local_90;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  Alloc *local_60;
  undefined8 local_58;
  Alloc *local_50;
  undefined8 local_48;
  Alloc *local_40 [2];
  
  local_68 = origin.super_Few<double,_2>.array_[1];
  local_70 = origin.super_Few<double,_2>.array_[0];
  local_78 = direction.super_Few<double,_2>.array_[1];
  local_80 = direction.super_Few<double,_2>.array_[0];
  Mesh::coords((Mesh *)local_40);
  average_field((Omega_h *)&local_50,mesh,ent_dim,2,(Reals *)local_40);
  if (((ulong)local_40[0] & 7) == 0 && local_40[0] != (Alloc *)0x0) {
    piVar1 = &local_40[0]->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40[0]);
      operator_delete(local_40[0],0x48);
    }
  }
  local_60 = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_58 = local_48;
  direction_00.super_Few<double,_2>.array_[1] = local_78;
  direction_00.super_Few<double,_2>.array_[0] = local_80;
  origin_00.super_Few<double,_2>.array_[1] = local_68;
  origin_00.super_Few<double,_2>.array_[0] = local_70;
  get_linear_scatter_coords<2>(&local_90,direction_00,origin_00);
  pAVar2 = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(pAVar2,0x48);
    }
  }
  local_b0.write_.shared_alloc_.alloc = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_90.write_.shared_alloc_.direct_ptr;
  local_a0.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.write_.shared_alloc_.alloc)->use_count =
           (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
  write_scatterplot(path,mesh,ent_dim,&local_b0,&local_a0,separator);
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(local_90.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
    }
  }
  return;
}

Assistant:

void write_linear_scatterplot(std::string const& path, Mesh* mesh, Int ent_dim,
    Reals data, Vector<dim> direction, Vector<dim> origin,
    std::string const& separator) {
  auto coords =
      average_field(mesh, ent_dim, dim, mesh->coords());  // get centroids
  auto coords_1d = get_linear_scatter_coords(coords, direction, origin);
  write_scatterplot(path, mesh, ent_dim, coords_1d, data, separator);
}